

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void DeserializeHDKeypath<DataStream>(DataStream *s,KeyOriginInfo *hd_keypath)

{
  KeyOriginInfo *in_RSI;
  KeyOriginInfo *in_RDI;
  long in_FS_OFFSET;
  uint64_t unaff_retaddr;
  DataStream *in_stack_00000008;
  bool in_stack_00000047;
  DataStream *in_stack_00000048;
  KeyOriginInfo *pKVar1;
  KeyOriginInfo local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ReadCompactSize<DataStream>(in_stack_00000048,in_stack_00000047);
  pKVar1 = &local_28;
  DeserializeKeyOrigin<DataStream>(in_stack_00000008,unaff_retaddr);
  KeyOriginInfo::operator=(in_RSI,pKVar1);
  KeyOriginInfo::~KeyOriginInfo(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DeserializeHDKeypath(Stream& s, KeyOriginInfo& hd_keypath)
{
    hd_keypath = DeserializeKeyOrigin(s, ReadCompactSize(s));
}